

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

GLuint glcts::findMSBU(GLuint input)

{
  GLuint result;
  GLuint GVar1;
  
  if (input == 0) {
    GVar1 = 0xffffffff;
  }
  else {
    GVar1 = 0x1f;
    for (; -1 < (int)input; input = input * 2) {
      GVar1 = GVar1 - 1;
    }
  }
  return GVar1;
}

Assistant:

static GLuint findMSBU(GLuint input)
{
	if (!input)
	{
		return -1;
	}
	for (GLuint result = 31;; --result)
	{
		if (input & 0x80000000)
		{
			return result;
		}
		input <<= 1;
	}
}